

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O0

int snap_sunk_store2(GCtrace *T,IRIns *ira,IRIns *irs)

{
  IRIns *local_30;
  IRIns *irk;
  IRIns *irs_local;
  IRIns *ira_local;
  GCtrace *T_local;
  
  if (((((irs->field_1).o == 'J') || ((irs->field_1).o == 'K')) || ((irs->field_1).o == 'M')) ||
     ((irs->field_1).o == 'N')) {
    local_30 = T->ir + (irs->field_0).op1;
    if (((local_30->field_1).o == '8') || ((local_30->field_1).o == '9')) {
      local_30 = T->ir + (local_30->field_0).op1;
    }
    T_local._4_4_ = (uint)(T->ir + (local_30->field_0).op1 == ira);
  }
  else {
    T_local._4_4_ = 0;
  }
  return T_local._4_4_;
}

Assistant:

static int snap_sunk_store2(GCtrace *T, IRIns *ira, IRIns *irs)
{
  if (irs->o == IR_ASTORE || irs->o == IR_HSTORE ||
      irs->o == IR_FSTORE || irs->o == IR_XSTORE) {
    IRIns *irk = &T->ir[irs->op1];
    if (irk->o == IR_AREF || irk->o == IR_HREFK)
      irk = &T->ir[irk->op1];
    return (&T->ir[irk->op1] == ira);
  }
  return 0;
}